

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::resize
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  size_type sVar2;
  prevector<8U,_int,_unsigned_int,_int> *ppVar3;
  prevector<8U,_int,_unsigned_int,_int> *ppVar4;
  uint in_ESI;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_type unaff_retaddr;
  iterator in_stack_00000008;
  iterator in_stack_00000010;
  ptrdiff_t increase;
  size_type cur_size;
  iterator *in_stack_ffffffffffffffa8;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  difference_type_conflict pos;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  
  pos = (difference_type_conflict)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar3 = in_RDI;
  sVar2 = size(in_RDI);
  if (sVar2 != in_ESI) {
    if (in_ESI < sVar2) {
      item_ptr(in_stack_ffffffffffffffc8,pos);
      iterator::iterator(in_stack_ffffffffffffffa8,(int *)0x928696);
      end(in_stack_ffffffffffffffb0);
      erase(ppVar3,in_stack_00000010,in_stack_00000008);
    }
    else {
      ppVar3 = (prevector<8U,_int,_unsigned_int,_int> *)(ulong)in_ESI;
      ppVar4 = (prevector<8U,_int,_unsigned_int,_int> *)capacity(ppVar3);
      if (ppVar4 < ppVar3) {
        change_capacity((prevector<8U,_int,_unsigned_int,_int> *)in_stack_00000008.ptr,unaff_retaddr
                       );
      }
      item_ptr(in_stack_ffffffffffffffc8,0);
      fill(in_RDI,(int *)ppVar3,(ptrdiff_t)in_stack_ffffffffffffffa8,(int *)0x92872a);
      in_RDI->_size = in_RDI->_size + (in_ESI - sVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void resize(size_type new_size) {
        size_type cur_size = size();
        if (cur_size == new_size) {
            return;
        }
        if (cur_size > new_size) {
            erase(item_ptr(new_size), end());
            return;
        }
        if (new_size > capacity()) {
            change_capacity(new_size);
        }
        ptrdiff_t increase = new_size - cur_size;
        fill(item_ptr(cur_size), increase);
        _size += increase;
    }